

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetEtaConstValue(void *kinmem,sunrealtype eta)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x1be;
  }
  else {
    if ((0.0 <= eta) && (eta <= 1.0)) {
      if ((eta != 0.0) || (NAN(eta))) {
        *(sunrealtype *)((long)kinmem + 0xa8) = eta;
      }
      else {
        *(undefined8 *)((long)kinmem + 0xa8) = 0x3fb999999999999a;
      }
      return 0;
    }
    msgfmt = "eta out of range.";
    error_code = -2;
    line = 0x1c6;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetEtaConstValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int KINSetEtaConstValue(void* kinmem, sunrealtype eta)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((eta < ZERO) || (eta > ONE))
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ETACONST);
    return (KIN_ILL_INPUT);
  }

  if (eta == ZERO) { kin_mem->kin_eta = POINT1; }
  else { kin_mem->kin_eta = eta; }

  return (KIN_SUCCESS);
}